

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  uint uVar2;
  sqlite3 *db;
  void *p;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  Column *pCVar4;
  Expr *pEVar5;
  ExprList_item *pEVar6;
  HashElem *pHVar7;
  size_t sVar8;
  ulong uVar9;
  Column *pCVar10;
  Column *extraout_RAX;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  u32 cnt;
  Hash ht;
  uint local_7c;
  Column *local_78;
  uint local_6c;
  Column **local_68;
  i16 *local_60;
  ulong local_58;
  ExprList_item *local_50;
  Hash local_48;
  
  db = pParse->db;
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  uVar14 = 0;
  if (pEList == (ExprList *)0x0) {
    pCVar4 = (Column *)0x0;
    uVar11 = 0;
  }
  else {
    uVar2 = pEList->nExpr;
    pCVar4 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar2 << 5);
    uVar11 = 0x7fff;
    if ((int)uVar2 < 0x7fff) {
      uVar11 = uVar2;
    }
  }
  *pnCol = (i16)uVar11;
  *paCol = pCVar4;
  local_78 = pCVar4;
  if (0 < (int)uVar11) {
    local_50 = pEList->a;
    local_58 = (ulong)uVar11;
    uVar15 = 0;
    local_6c = uVar11;
    local_68 = paCol;
    local_60 = pnCol;
    do {
      if (db->mallocFailed != '\0') goto LAB_0019e085;
      pcVar16 = local_50[uVar15].zName;
      if (pcVar16 == (char *)0x0) {
        pEVar5 = local_50[uVar15].pExpr;
        while ((pEVar5 != (Expr *)0x0 && ((pEVar5->flags & 0x41000) != 0))) {
          if ((pEVar5->flags >> 0x12 & 1) == 0) {
            pEVar6 = (ExprList_item *)&pEVar5->pLeft;
          }
          else {
            pEVar6 = ((pEVar5->x).pList)->a;
          }
          pEVar5 = pEVar6->pExpr;
        }
        for (; uVar1 = pEVar5->op, uVar1 == 0x86; pEVar5 = pEVar5->pRight) {
        }
        if (uVar1 == ';') {
          pCVar10 = (Column *)&pEVar5->u;
        }
        else if (uVar1 == 0xa2) {
          uVar12 = pEVar5->iColumn;
          if ((short)uVar12 < 0) {
            uVar12 = ((pEVar5->y).pTab)->iPKey;
          }
          pcVar16 = "rowid";
          if ((short)uVar12 < 0) goto LAB_0019df72;
          pCVar10 = ((pEVar5->y).pTab)->aCol + uVar12;
        }
        else {
          pCVar10 = (Column *)&local_50[uVar15].zSpan;
        }
        pcVar16 = pCVar10->zName;
      }
LAB_0019df72:
      if (pcVar16 == (char *)0x0) {
        pcVar16 = sqlite3MPrintf(db,"column%d",(ulong)((int)uVar15 + 1));
      }
      else {
        pcVar16 = sqlite3DbStrDup(db,pcVar16);
      }
      local_7c = 0;
      while (pcVar16 != (char *)0x0) {
        pHVar7 = findElementWithHash(&local_48,pcVar16,(uint *)0x0);
        if (pHVar7->data == (void *)0x0) {
          pCVar4->zName = pcVar16;
          pCVar10 = (Column *)sqlite3HashInsert(&local_48,pcVar16,pCVar4);
          if (pCVar10 == pCVar4) {
            sqlite3OomFault(db);
          }
          goto LAB_0019e068;
        }
        sVar8 = strlen(pcVar16);
        if ((sVar8 & 0x3fffffff) == 0) {
          uVar13 = 0;
        }
        else {
          uVar9 = (ulong)((uint)sVar8 & 0x3fffffff);
          do {
            if ((long)uVar9 < 2) {
              uVar9 = 0;
              break;
            }
            lVar17 = uVar9 - 1;
            uVar9 = uVar9 - 1;
          } while (0xfffffffffffffff5 < (ulong)(byte)pcVar16[lVar17] - 0x3a);
          uVar13 = (ulong)((uint)sVar8 & 0x3fffffff);
          if (pcVar16[uVar9 & 0xffffffff] == ':') {
            uVar13 = uVar9 & 0xffffffff;
          }
        }
        local_7c = local_7c + 1;
        pcVar16 = sqlite3MPrintf(db,"%.*z:%u",uVar13,pcVar16);
        if (3 < local_7c) {
          sqlite3_randomness(4,&local_7c);
        }
      }
      pCVar4->zName = (char *)0x0;
LAB_0019e068:
      uVar15 = uVar15 + 1;
      pCVar4 = pCVar4 + 1;
    } while (uVar15 != local_58);
    uVar15 = (ulong)local_6c;
LAB_0019e085:
    uVar14 = (uint)uVar15;
    pnCol = local_60;
    paCol = local_68;
  }
  sqlite3HashClear(&local_48);
  iVar3 = extraout_EAX;
  if (db->mallocFailed != '\0') {
    if (uVar14 != 0) {
      lVar17 = 0;
      do {
        p = *(void **)((long)&local_78->zName + lVar17);
        pCVar4 = local_78;
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
          pCVar4 = extraout_RAX;
        }
        iVar3 = (int)pCVar4;
        lVar17 = lVar17 + 0x20;
      } while ((ulong)uVar14 << 5 != lVar17);
    }
    if (local_78 != (Column *)0x0) {
      sqlite3DbFreeNN(db,local_78);
      iVar3 = extraout_EAX_00;
    }
    *paCol = (Column *)0x0;
    *pnCol = 0;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( nCol>32767 ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      assert( pColExpr->op!=TK_AGG_COLUMN );
      if( pColExpr->op==TK_COLUMN ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->y.pTab;
        assert( pTab!=0 );
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}